

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall Lexer::advance(Lexer *this)

{
  ulong uVar1;
  Lexer *pLVar2;
  
  uVar1 = (long)this->index_ + 1;
  this->index_ = (int)uVar1;
  pLVar2 = (Lexer *)((this->input_)._M_dataplus._M_p + uVar1);
  if ((this->input_)._M_string_length <= uVar1) {
    pLVar2 = this;
  }
  this->current_ = pLVar2->npos;
  maintain_position(this);
  return;
}

Assistant:

void Lexer::advance() {
    index_++;
    if (index_ >= input_.length()) {
        current_ = npos;
    } else {
        current_ = input_[index_];
    }
    maintain_position();
}